

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_avx2.c
# Opt level: O0

__m256i * blend_16_u8_avx2(uint8_t *src0,uint8_t *src1,__m256i *v_m0_b,__m256i *v_m1_b,int32_t bits)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  __m256i v_val_w;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  __m256i *palVar5;
  undefined1 (*in_RCX) [32];
  undefined1 (*in_RDX) [32];
  void *in_RSI;
  void *in_RDI;
  undefined8 in_XMM0_Qa;
  undefined8 uVar6;
  undefined8 in_XMM0_Qb;
  undefined8 uVar7;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM1_Qb;
  __m256i v_res;
  __m256i v_res_b;
  __m256i v_res0_w;
  __m256i v_p0_w;
  __m256i v_s1_s_b;
  __m256i v_s0_s_b;
  __m256i v_s1_b;
  __m256i v_s0_b;
  int in_stack_fffffffffffffd74;
  longlong in_stack_fffffffffffffd78;
  undefined1 in_stack_fffffffffffffd80 [24];
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  
  xx_loadu_128(in_RDI);
  uVar6 = in_XMM0_Qa;
  uVar7 = in_XMM0_Qb;
  xx_loadu_128(in_RSI);
  auVar1._8_8_ = in_XMM0_Qb;
  auVar1._0_8_ = in_XMM0_Qa;
  auVar1._16_8_ = in_XMM1_Qa;
  auVar1._24_8_ = in_XMM1_Qb;
  auVar1 = vpermq_avx2(auVar1,0xd8);
  auVar2._8_8_ = uVar7;
  auVar2._0_8_ = uVar6;
  auVar2._16_8_ = in_XMM1_Qa;
  auVar2._24_8_ = in_XMM1_Qb;
  auVar2 = vpermq_avx2(auVar2,0xd8);
  auVar1 = vpunpcklbw_avx2(auVar1,auVar2);
  auVar2 = vpunpcklbw_avx2(*in_RDX,*in_RCX);
  auVar1 = vpmaddubsw_avx2(auVar1,auVar2);
  local_240 = auVar1._0_8_;
  uStack_238 = auVar1._8_8_;
  uStack_230 = auVar1._16_8_;
  uStack_228 = auVar1._24_8_;
  v_val_w[1] = in_stack_fffffffffffffd80._0_8_;
  v_val_w[2] = in_stack_fffffffffffffd80._8_8_;
  v_val_w[3] = in_stack_fffffffffffffd80._16_8_;
  v_val_w[0] = in_stack_fffffffffffffd78;
  palVar5 = yy_roundn_epu16(v_val_w,in_stack_fffffffffffffd74);
  auVar4._8_8_ = uStack_238;
  auVar4._0_8_ = local_240;
  auVar4._16_8_ = uStack_230;
  auVar4._24_8_ = uStack_228;
  auVar3._8_8_ = uStack_238;
  auVar3._0_8_ = local_240;
  auVar3._16_8_ = uStack_230;
  auVar3._24_8_ = uStack_228;
  auVar1 = vpackuswb_avx2(auVar4,auVar3);
  vpermq_avx2(auVar1,0xd8);
  return palVar5;
}

Assistant:

static inline __m256i blend_16_u8_avx2(const uint8_t *src0, const uint8_t *src1,
                                       const __m256i *v_m0_b,
                                       const __m256i *v_m1_b,
                                       const int32_t bits) {
  const __m256i v_s0_b = _mm256_castsi128_si256(xx_loadu_128(src0));
  const __m256i v_s1_b = _mm256_castsi128_si256(xx_loadu_128(src1));
  const __m256i v_s0_s_b = _mm256_permute4x64_epi64(v_s0_b, 0xd8);
  const __m256i v_s1_s_b = _mm256_permute4x64_epi64(v_s1_b, 0xd8);

  const __m256i v_p0_w =
      _mm256_maddubs_epi16(_mm256_unpacklo_epi8(v_s0_s_b, v_s1_s_b),
                           _mm256_unpacklo_epi8(*v_m0_b, *v_m1_b));

  const __m256i v_res0_w = yy_roundn_epu16(v_p0_w, bits);
  const __m256i v_res_b = _mm256_packus_epi16(v_res0_w, v_res0_w);
  const __m256i v_res = _mm256_permute4x64_epi64(v_res_b, 0xd8);
  return v_res;
}